

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomLayoutItem::read(DomLayoutItem *this,int __fd,void *__buf,size_t __nbytes)

{
  storage_type_conflict *psVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  DomWidget *this_00;
  DomLayout *this_01;
  DomSpacer *this_02;
  char16_t *pcVar5;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  long lVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QString local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar6 = 0;
    do {
      psVar1 = *(storage_type_conflict **)(local_50.ptr + lVar6 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x10);
      local_68.m_data = psVar1;
      switch(local_68.m_size) {
      case 3:
        QVar8.m_data = L"row";
        QVar8.m_size = 3;
        QVar15.m_data = psVar1;
        QVar15.m_size = 3;
        cVar2 = QtPrivate::equalStrings(QVar15,QVar8);
        if (cVar2 == '\0') goto switchD_0015f074_caseD_4;
        QVar16.m_data = *(storage_type_conflict **)(local_50.ptr + lVar6 + 0x50);
        QVar16.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x58);
        lVar4 = QString::toIntegral_helper(QVar16,(bool *)0x0,10);
        iVar3 = (int)lVar4;
        if (iVar3 != lVar4) {
          iVar3 = 0;
        }
        this->m_attr_row = iVar3;
        this->m_has_attr_row = true;
        break;
      default:
switchD_0015f074_caseD_4:
        local_98.a.m_size = 0x15;
        local_98.a.m_data = "Unexpected attribute ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>(&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
        goto LAB_0015f24d;
      case 6:
        QVar10.m_data = L"column";
        QVar10.m_size = 6;
        QVar19.m_data = psVar1;
        QVar19.m_size = 6;
        cVar2 = QtPrivate::equalStrings(QVar19,QVar10);
        if (cVar2 == '\0') goto switchD_0015f074_caseD_4;
        QVar20.m_data = *(storage_type_conflict **)(local_50.ptr + lVar6 + 0x50);
        QVar20.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x58);
        lVar4 = QString::toIntegral_helper(QVar20,(bool *)0x0,10);
        iVar3 = (int)lVar4;
        if (iVar3 != lVar4) {
          iVar3 = 0;
        }
        this->m_attr_column = iVar3;
        this->m_has_attr_column = true;
        break;
      case 7:
        QVar9.m_data = L"rowspan";
        QVar9.m_size = 7;
        QVar17.m_data = psVar1;
        QVar17.m_size = 7;
        cVar2 = QtPrivate::equalStrings(QVar17,QVar9);
        if (cVar2 == '\0') {
          QVar11.m_data = L"colspan";
          QVar11.m_size = 7;
          QVar22.m_data = psVar1;
          QVar22.m_size = 7;
          cVar2 = QtPrivate::equalStrings(QVar22,QVar11);
          if (cVar2 == '\0') goto switchD_0015f074_caseD_4;
          QVar23.m_data = *(storage_type_conflict **)(local_50.ptr + lVar6 + 0x50);
          QVar23.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x58);
          lVar4 = QString::toIntegral_helper(QVar23,(bool *)0x0,10);
          iVar3 = (int)lVar4;
          if (iVar3 != lVar4) {
            iVar3 = 0;
          }
          this->m_attr_colSpan = iVar3;
          this->m_has_attr_colSpan = true;
        }
        else {
          QVar18.m_data = *(storage_type_conflict **)(local_50.ptr + lVar6 + 0x50);
          QVar18.m_size = *(qsizetype *)(local_50.ptr + lVar6 + 0x58);
          lVar4 = QString::toIntegral_helper(QVar18,(bool *)0x0,10);
          iVar3 = (int)lVar4;
          if (iVar3 != lVar4) {
            iVar3 = 0;
          }
          this->m_attr_rowSpan = iVar3;
          this->m_has_attr_rowSpan = true;
        }
        break;
      case 9:
        QVar7.m_data = L"alignment";
        QVar7.m_size = 9;
        QVar21.m_data = psVar1;
        QVar21.m_size = 9;
        cVar2 = QtPrivate::equalStrings(QVar21,QVar7);
        if (cVar2 == '\0') goto switchD_0015f074_caseD_4;
        QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar6 + 0x50),
                         *(longlong *)(local_50.ptr + lVar6 + 0x58));
        QString::operator=(&this->m_attr_alignment,&local_80);
        this->m_has_attr_alignment = true;
LAB_0015f24d:
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      lVar6 = lVar6 + 0x68;
    } while (local_50.size * 0x68 - lVar6 != 0);
  }
  iVar3 = QXmlStreamReader::error();
  if (iVar3 == 0) {
    do {
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 == 4) {
        local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        QVar7 = (QStringView)QXmlStreamReader::name();
        QVar12.m_data = L"widget";
        QVar12.m_size = 6;
        pcVar5 = L"widget";
        local_68 = QVar7;
        iVar3 = QtPrivate::compareStrings(QVar7,QVar12,CaseInsensitive);
        if (iVar3 == 0) {
          this_00 = (DomWidget *)operator_new(0x160);
          memset(this_00,0,0x160);
          DomWidget::read(this_00,__fd,__buf_00,(size_t)pcVar5);
          clear(this);
          this->m_kind = Widget;
          this->m_widget = this_00;
        }
        else {
          QVar13.m_data = L"layout";
          QVar13.m_size = 6;
          pcVar5 = L"layout";
          iVar3 = QtPrivate::compareStrings(QVar7,QVar13,CaseInsensitive);
          if (iVar3 == 0) {
            this_01 = (DomLayout *)operator_new(0x128);
            memset(this_01,0,0x128);
            DomLayout::read(this_01,__fd,__buf_01,(size_t)pcVar5);
            clear(this);
            this->m_kind = Layout;
            this->m_layout = this_01;
          }
          else {
            QVar14.m_data = L"spacer";
            QVar14.m_size = 6;
            pcVar5 = L"spacer";
            iVar3 = QtPrivate::compareStrings(QVar7,QVar14,CaseInsensitive);
            if (iVar3 == 0) {
              this_02 = (DomSpacer *)operator_new(0x38);
              (this_02->m_attr_name).d.d = (Data *)0x0;
              (this_02->m_attr_name).d.ptr = (char16_t *)0x0;
              (this_02->m_attr_name).d.size = 0;
              this_02->m_has_attr_name = false;
              *(undefined3 *)&this_02->field_0x19 = 0;
              this_02->m_children = 0;
              (this_02->m_property).d.d = (Data *)0x0;
              (this_02->m_property).d.ptr = (DomProperty **)0x0;
              (this_02->m_property).d.size = 0;
              DomSpacer::read(this_02,__fd,__buf_02,(size_t)pcVar5);
              clear(this);
              this->m_kind = Spacer;
              this->m_spacer = this_02;
            }
            else {
              local_98.a.m_size = 0x13;
              local_98.a.m_data = "Unexpected element ";
              local_98.b = &local_68;
              QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                        (&local_80,&local_98);
              QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
              if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
          }
        }
      }
      else if (iVar3 == 5) break;
      iVar3 = QXmlStreamReader::error();
    } while (iVar3 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomLayoutItem::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"row"_s) {
            setAttributeRow(attribute.value().toInt());
            continue;
        }
        if (name == u"column"_s) {
            setAttributeColumn(attribute.value().toInt());
            continue;
        }
        if (name == u"rowspan"_s) {
            setAttributeRowSpan(attribute.value().toInt());
            continue;
        }
        if (name == u"colspan"_s) {
            setAttributeColSpan(attribute.value().toInt());
            continue;
        }
        if (name == u"alignment"_s) {
            setAttributeAlignment(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"widget"_s, Qt::CaseInsensitive)) {
                auto *v = new DomWidget();
                v->read(reader);
                setElementWidget(v);
                continue;
            }
            if (!tag.compare(u"layout"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayout();
                v->read(reader);
                setElementLayout(v);
                continue;
            }
            if (!tag.compare(u"spacer"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSpacer();
                v->read(reader);
                setElementSpacer(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}